

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

void __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::EmitBr
          (BinaryReaderInterp *this,Index depth,Index drop_count,Index keep_count,
          Index catch_drop_count)

{
  u32 val;
  pointer pLVar1;
  pointer pLVar2;
  Offset offset;
  Label *pLVar3;
  
  Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
  Istream::EmitCatchDrop(this->istream_,catch_drop_count);
  pLVar3 = GetLabel(this,depth);
  val = pLVar3->offset;
  Istream::Emit(this->istream_,Br);
  if (val == 0xffffffff) {
    pLVar1 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar2 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    offset = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar1 - (long)pLVar2) >> 4) + ~depth,
                     offset);
  }
  Istream::Emit(this->istream_,val);
  return;
}

Assistant:

void BinaryReaderInterp::EmitBr(Index depth,
                                Index drop_count,
                                Index keep_count,
                                Index catch_drop_count) {
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);
  Istream::Offset offset = GetLabel(depth)->offset;
  istream_.Emit(Opcode::Br);
  if (offset == Istream::kInvalidOffset) {
    // depth_fixups_ stores the depth counting up from zero, where zero is the
    // top-level function scope.
    depth_fixups_.Append(label_stack_.size() - 1 - depth, istream_.end());
  }
  istream_.Emit(offset);
}